

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_spatializer_listener_get_heap_size
                    (ma_spatializer_listener_config *pConfig,size_t *pHeapSizeInBytes)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if (((pHeapSizeInBytes != (size_t *)0x0) &&
      (*pHeapSizeInBytes = 0, pConfig != (ma_spatializer_listener_config *)0x0)) &&
     ((ulong)pConfig->channelsOut != 0)) {
    *pHeapSizeInBytes = (ulong)pConfig->channelsOut + 7 & 0xfffffffffffffff8;
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_spatializer_listener_get_heap_size(const ma_spatializer_listener_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_result result;
    ma_spatializer_listener_heap_layout heapLayout;

    if (pHeapSizeInBytes == NULL) {
        return MA_INVALID_ARGS;
    }

    *pHeapSizeInBytes = 0;

    result = ma_spatializer_listener_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    *pHeapSizeInBytes = heapLayout.sizeInBytes;

    return MA_SUCCESS;
}